

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Functional::anon_unknown_2::BlendColorCase::test(BlendColorCase *this)

{
  CallLogWrapper *this_00;
  GLfloat red;
  GLfloat green;
  GLfloat blue;
  GLfloat alpha;
  int iVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Random rnd;
  deRandom local_38;
  
  deRandom_init(&local_38,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[5])
            (0,0,0,0,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x8005);
  lVar2 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  do {
    red = *(GLfloat *)((long)&DAT_00b3a660 + lVar2);
    green = *(GLfloat *)((long)&DAT_00b3a664 + lVar2);
    blue = *(GLfloat *)((long)&DAT_00b3a668 + lVar2);
    alpha = *(GLfloat *)((long)&DAT_00b3a66c + lVar2);
    glu::CallLogWrapper::glBlendColor(this_00,red,green,blue,alpha);
    (*this->m_verifier->_vptr_StateVerifier[5])
              (red,green,blue,alpha,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x8005);
    ApiCase::expectError(&this->super_ApiCase,0);
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  iVar1 = 0x78;
  do {
    fVar3 = deRandom_getFloat(&local_38);
    fVar4 = deRandom_getFloat(&local_38);
    fVar5 = deRandom_getFloat(&local_38);
    fVar6 = deRandom_getFloat(&local_38);
    glu::CallLogWrapper::glBlendColor(this_00,fVar3 + 0.0,fVar4 + 0.0,fVar5 + 0.0,fVar6 + 0.0);
    (*this->m_verifier->_vptr_StateVerifier[5])
              (fVar3 + 0.0,fVar4 + 0.0,fVar5 + 0.0,fVar6 + 0.0,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x8005);
    ApiCase::expectError(&this->super_ApiCase,0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloat4Color(m_testCtx, GL_BLEND_COLOR, 0, 0, 0, 0);
		expectError(GL_NO_ERROR);

		const struct FixedTest
		{
			float r, g, b, a;
		} fixedTests[] =
		{
			{ 0.5f, 1.0f, 0.5f, 1.0f },
			{ 0.0f, 0.5f, 0.0f, 0.5f },
			{ 0.0f, 0.0f, 0.0f, 0.0f },
			{ 1.0f, 1.0f, 1.0f, 1.0f },
		};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fixedTests); ++ndx)
		{
			glBlendColor(fixedTests[ndx].r, fixedTests[ndx].g, fixedTests[ndx].b, fixedTests[ndx].a);
			m_verifier->verifyFloat4Color(m_testCtx, GL_BLEND_COLOR, fixedTests[ndx].r, fixedTests[ndx].g, fixedTests[ndx].b, fixedTests[ndx].a);
			expectError(GL_NO_ERROR);
		}

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLfloat r = rnd.getFloat(0, 1);
			const GLfloat g = rnd.getFloat(0, 1);
			const GLfloat b = rnd.getFloat(0, 1);
			const GLfloat a = rnd.getFloat(0, 1);

			glBlendColor(r, g, b, a);
			m_verifier->verifyFloat4Color(m_testCtx, GL_BLEND_COLOR, r, g, b, a);
			expectError(GL_NO_ERROR);
		}
	}